

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O1

void __thiscall CBinds::GetKeyID(CBinds *this,char *pBindStr,int *KeyID,int *Modifier)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int LocalKeyID;
  long lVar4;
  int LocalModifier;
  long lVar5;
  char (*a) [4] [128];
  char (*paacVar6) [4] [128];
  char (*local_48) [4] [128];
  
  *KeyID = 0x1da;
  *Modifier = 4;
  local_48 = this->m_aaaKeyBindings;
  lVar4 = 0;
  do {
    lVar5 = 0;
    paacVar6 = local_48;
    do {
      a = (char (*) [4] [128])0x1e33dc;
      if ((int)lVar4 - 1U < 0x1d9) {
        a = paacVar6;
      }
      if ((*a)[0][0] == '\0') {
        iVar2 = 7;
      }
      else {
        iVar2 = str_comp((char *)a,pBindStr);
        if (iVar2 == 0) {
          iVar1 = 1;
        }
        else {
          pcVar3 = str_find((char *)a,pBindStr);
          iVar2 = 0;
          iVar1 = 0;
          if (pcVar3 == (char *)0x0) goto LAB_0013484b;
        }
        iVar2 = iVar1;
        *KeyID = (int)lVar4;
        *Modifier = (int)lVar5;
      }
LAB_0013484b:
      if ((iVar2 != 7) && (iVar2 != 0)) {
        return;
      }
      lVar5 = lVar5 + 1;
      paacVar6 = (char (*) [4] [128])(*paacVar6 + 1);
    } while (lVar5 != 4);
    lVar4 = lVar4 + 1;
    local_48 = local_48 + 1;
    if (lVar4 == 0x1da) {
      return;
    }
  } while( true );
}

Assistant:

void CBinds::GetKeyID(const char *pBindStr, int& KeyID, int& Modifier)
{
	KeyID = KEY_LAST;
	Modifier = MODIFIER_COUNT;

	for(int LocalKeyID = 0; LocalKeyID < KEY_LAST; LocalKeyID++)
	{
		for(int LocalModifier = 0; LocalModifier < MODIFIER_COUNT; LocalModifier++)
		{
			const char *pBind = Get(LocalKeyID, LocalModifier);
			if(!pBind[0])
				continue;

			if(str_comp(pBind, pBindStr) == 0)
			{
				KeyID = LocalKeyID;
				Modifier = LocalModifier;
				return;
			}
			if(str_find(pBind, pBindStr) != 0)
			{
				KeyID = LocalKeyID;
				Modifier = LocalModifier;
			}
		}
	}
}